

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void dequantize_row_iq2_s(block_iq2_s *x,float *y,int64_t k)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  byte bVar5;
  undefined4 uVar6;
  undefined1 auVar7 [13];
  undefined1 auVar8 [13];
  undefined1 auVar9 [13];
  ulong uVar10;
  undefined1 auVar11 [13];
  long lVar12;
  long lVar13;
  uint8_t *puVar14;
  int l;
  ulong uVar15;
  long lVar16;
  uint8_t *puVar17;
  long lVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  char cVar24;
  char cVar30;
  uint uVar25;
  char cVar28;
  char cVar29;
  uint uVar31;
  undefined1 auVar27 [16];
  undefined8 local_38;
  float db [2];
  undefined1 auVar26 [12];
  
  lVar12 = k + 0xff;
  if (-1 < k) {
    lVar12 = k;
  }
  if (0xff < k) {
    lVar13 = 0;
    do {
      puVar14 = x[lVar13].qs;
      puVar17 = x[lVar13].qs + 0x20;
      fVar2 = ggml_table_f32_f16[x[lVar13].d];
      lVar18 = 0;
      do {
        local_38 = CONCAT44(((float)(x[lVar13].scales[lVar18] >> 4) + 0.5) * fVar2 * 0.25,
                            ((float)(x[lVar13].scales[lVar18] & 0xf) + 0.5) * fVar2 * 0.25);
        bVar4 = x[lVar13].qh[lVar18];
        uVar15 = 0;
        do {
          bVar5 = puVar14[uVar15];
          fVar3 = *(float *)((long)&local_38 + (uVar15 >> 1 & 0x7fffffff) * 4);
          auVar19 = ZEXT216(CONCAT11(puVar17[uVar15],puVar17[uVar15]));
          auVar19 = pshuflw(auVar19,auVar19,0);
          lVar16 = 0;
          do {
            uVar6 = *(undefined4 *)
                     ((long)iq2s_grid +
                     lVar16 + (ulong)((uint)bVar4 << ((char)uVar15 * -2 + 8U & 0x1f) & 0x300 |
                                     (uint)bVar5) * 8);
            uVar10 = (ulong)(ushort)uVar6 & 0xffffffffffff00ff;
            auVar7._8_4_ = 0;
            auVar7._0_8_ = uVar10;
            auVar7[0xc] = (char)((uint)uVar6 >> 0x18);
            auVar8[8] = (char)((uint)uVar6 >> 0x10);
            auVar8._0_8_ = uVar10;
            auVar8[9] = 0;
            auVar8._10_3_ = auVar7._10_3_;
            auVar11._5_8_ = 0;
            auVar11._0_5_ = auVar8._8_5_;
            auVar9[4] = (char)((uint)uVar6 >> 8);
            auVar9._0_4_ = (int)uVar10;
            auVar9[5] = 0;
            auVar9._6_7_ = SUB137(auVar11 << 0x40,6);
            fVar20 = (float)(int)uVar10 * fVar3;
            fVar21 = (float)auVar9._4_4_ * fVar3;
            fVar22 = (float)auVar8._8_4_ * fVar3;
            fVar23 = (float)(uint3)(auVar7._10_3_ >> 0x10) * fVar3;
            auVar27 = ZEXT416(*(uint *)(kmask_iq2xs + lVar16)) & auVar19;
            cVar30 = auVar27[3];
            cVar29 = auVar27[2];
            cVar28 = auVar27[1];
            cVar24 = auVar27[0];
            uVar25 = CONCAT13(-(cVar24 == '\0'),
                              CONCAT12(-(cVar24 == '\0'),
                                       CONCAT11(-(cVar24 == '\0'),-(cVar24 == '\0'))));
            auVar26._0_8_ =
                 CONCAT17(-(cVar28 == '\0'),
                          CONCAT16(-(cVar28 == '\0'),
                                   CONCAT15(-(cVar28 == '\0'),CONCAT14(-(cVar28 == '\0'),uVar25))));
            auVar26[8] = -(cVar29 == '\0');
            auVar26[9] = -(cVar29 == '\0');
            auVar26[10] = -(cVar29 == '\0');
            auVar26[0xb] = -(cVar29 == '\0');
            auVar27[0xc] = -(cVar30 == '\0');
            auVar27._0_12_ = auVar26;
            auVar27[0xd] = -(cVar30 == '\0');
            auVar27[0xe] = -(cVar30 == '\0');
            auVar27[0xf] = -(cVar30 == '\0');
            uVar31 = (uint)((ulong)auVar26._0_8_ >> 0x20);
            pfVar1 = y + lVar16;
            *pfVar1 = (float)(~uVar25 & (uint)-fVar20 | (uint)fVar20 & uVar25);
            pfVar1[1] = (float)(~uVar31 & (uint)-fVar21 | (uint)fVar21 & uVar31);
            pfVar1[2] = (float)(~auVar26._8_4_ & (uint)-fVar22 | (uint)fVar22 & auVar26._8_4_);
            pfVar1[3] = (float)(~auVar27._12_4_ & (uint)-fVar23 | (uint)fVar23 & auVar27._12_4_);
            lVar16 = lVar16 + 4;
          } while (lVar16 != 8);
          y = y + 8;
          uVar15 = uVar15 + 1;
        } while (uVar15 != 4);
        puVar14 = puVar14 + 4;
        puVar17 = puVar17 + 4;
        lVar18 = lVar18 + 1;
      } while (lVar18 != 8);
      lVar13 = lVar13 + 1;
    } while (lVar13 != lVar12 >> 8);
  }
  return;
}

Assistant:

void dequantize_row_iq2_s(const block_iq2_s * GGML_RESTRICT x, float * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    float db[2];

    for (int i = 0; i < nb; i++) {

        const float d = GGML_FP16_TO_FP32(x[i].d);
        const uint8_t * qs = x[i].qs;
        const uint8_t * qh = x[i].qh;
        const uint8_t * signs = qs + QK_K/8;

        for (int ib32 = 0; ib32 < QK_K/32; ++ib32) {
            db[0] = d * (0.5f + (x[i].scales[ib32] & 0xf)) * 0.25f;
            db[1] = d * (0.5f + (x[i].scales[ib32] >>  4)) * 0.25f;
            for (int l = 0; l < 4; ++l) {
                const float dl = db[l/2];
                const uint8_t * grid = (const uint8_t *)(iq2s_grid + (qs[l] | (qh[ib32] << (8-2*l) & 0x300)));
                for (int j = 0; j < 8; ++j) {
                    y[j] = dl * grid[j] * (signs[l] & kmask_iq2xs[j] ? -1.f : 1.f);
                }
                y += 8;
            }
            qs += 4;
            signs += 4;
        }
    }
}